

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

qsizetype QtPrivate::indexOf<QModelIndex,QModelIndex>
                    (QList<QModelIndex> *vector,QModelIndex *u,qsizetype from)

{
  ulong uVar1;
  QModelIndex *pQVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  
  if (from < 0) {
    from = from + (vector->d).size;
    if (from < 1) {
      from = 0;
    }
  }
  uVar1 = (vector->d).size;
  if ((ulong)from < uVar1) {
    pQVar2 = (vector->d).ptr;
    lVar4 = from * 0x18;
    lVar3 = uVar1 * 8;
    bVar5 = false;
    do {
      if ((((*(int *)((long)&pQVar2->r + lVar4) == u->r) &&
           (*(int *)((long)&pQVar2->c + lVar4) == u->c)) &&
          (*(quintptr *)((long)&pQVar2->i + lVar4) == u->i)) &&
         (*(QAbstractItemModel **)((long)&(pQVar2->m).ptr + lVar4) == (u->m).ptr)) {
        lVar3 = (lVar4 >> 3) * -0x5555555555555555;
        break;
      }
      lVar4 = lVar4 + 0x18;
      bVar5 = uVar1 * 0x18 == lVar4;
    } while (!bVar5);
    if (!bVar5) {
      return lVar3;
    }
  }
  return -1;
}

Assistant:

qsizetype indexOf(const QList<T> &vector, const U &u, qsizetype from) noexcept
{
    if (from < 0)
        from = qMax(from + vector.size(), qsizetype(0));
    if (from < vector.size()) {
        auto n = vector.begin() + from - 1;
        auto e = vector.end();
        while (++n != e)
            if (*n == u)
                return qsizetype(n - vector.begin());
    }
    return -1;
}